

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::ubjson::
basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_type_and_value
          (basic_ubjson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
           *this,json_visitor *visitor,error_code *ec)

{
  size_t *psVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint8_t b;
  uint8_t local_9;
  
  puVar2 = (this->source_).current_._M_current;
  bVar5 = (this->source_).end_._M_current != puVar2;
  uVar3 = (ulong)bVar5;
  if (!bVar5) {
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar3;
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    return;
  }
  uVar4 = 0;
  do {
    (this->source_).current_._M_current = puVar2 + 1;
    (&local_9)[uVar4] = *puVar2;
    uVar4 = uVar4 + 1;
    puVar2 = puVar2 + 1;
  } while (uVar3 != uVar4);
  psVar1 = &(this->source_).position_;
  *psVar1 = *psVar1 + uVar3;
  read_value(this,visitor,local_9,ec);
  return;
}

Assistant:

void read_type_and_value(json_visitor& visitor, std::error_code& ec)
    {
        if (source_.is_error())
        {
            ec = ubjson_errc::source_error;
            more_ = false;
            return;
        }   

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = ubjson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        read_value(visitor, b, ec);
    }